

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cc
# Opt level: O0

int setSocketNonBlocking(int fd)

{
  uint uVar1;
  int iVar2;
  int flag;
  int fd_local;
  
  uVar1 = fcntl(fd,3,0);
  if (uVar1 == 0xffffffff) {
    flag = -1;
  }
  else {
    iVar2 = fcntl(fd,4,(ulong)(uVar1 | 0x800));
    if (iVar2 == -1) {
      flag = -1;
    }
    else {
      flag = 0;
    }
  }
  return flag;
}

Assistant:

int setSocketNonBlocking(int fd) {
//	std::cout << "开始设置非阻塞" << std::endl;
//	std::cout << "fd = " << fd << std::endl;
  int flag = fcntl(fd, F_GETFL, 0);
//  std::cout << "flag = " << flag << std::endl;
  if (flag == -1) return -1;

  flag |= O_NONBLOCK;
  if (fcntl(fd, F_SETFL, flag) == -1) return -1;

//	std::cout << "成功设置非阻塞" << std::endl;

  return 0;
}